

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

void PPrintXmlDecl(TidyDocImpl *doc,uint indent,Node *node)

{
  ulong uVar1;
  uint saveWrap_00;
  TidyPrintImpl *pprint_00;
  AttVal *pAVar2;
  Bool ucAttrs;
  TidyPrintImpl *pprint;
  uint saveWrap;
  AttVal *att;
  Node *node_local;
  uint indent_local;
  TidyDocImpl *doc_local;
  
  pprint_00 = &doc->pprint;
  SetWrap(doc,indent);
  saveWrap_00 = WrapOff(doc);
  uVar1 = (doc->config).value[0x54].v;
  prvTidySetOptionInt(doc,TidyUpperCaseAttrs,0);
  AddString(pprint_00,"<?xml");
  pAVar2 = prvTidyAttrGetById(node,TidyAttr_VERSION);
  if (pAVar2 != (AttVal *)0x0) {
    PPrintAttribute(doc,indent,node,pAVar2);
  }
  pAVar2 = prvTidyAttrGetById(node,TidyAttr_ENCODING);
  if (pAVar2 != (AttVal *)0x0) {
    PPrintAttribute(doc,indent,node,pAVar2);
  }
  pAVar2 = prvTidyGetAttrByName(node,"standalone");
  if (pAVar2 != (AttVal *)0x0) {
    PPrintAttribute(doc,indent,node,pAVar2);
  }
  prvTidySetOptionInt(doc,TidyUpperCaseAttrs,uVar1 & 0xffffffff);
  if ((node->end == 0) || (doc->lexer->lexbuf[node->end - 1] != '?')) {
    AddChar(pprint_00,0x3f);
  }
  AddChar(pprint_00,0x3e);
  WrapOn(doc,saveWrap_00);
  prvTidyPFlushLineSmart(doc,indent);
  return;
}

Assistant:

static void PPrintXmlDecl( TidyDocImpl* doc, uint indent, Node *node )
{
    AttVal* att;
    uint saveWrap;
    TidyPrintImpl* pprint = &doc->pprint;
    Bool ucAttrs;
    SetWrap( doc, indent );
    saveWrap = WrapOff( doc );

    /* no case translation for XML declaration pseudo attributes */
    ucAttrs = cfg(doc, TidyUpperCaseAttrs);
    TY_(SetOptionInt)(doc, TidyUpperCaseAttrs, no);

    AddString( pprint, "<?xml" );

    /* Force order of XML declaration attributes */
    /* PPrintAttrs( doc, indent, node ); */
    if ( NULL != (att = TY_(AttrGetById)(node, TidyAttr_VERSION)) )
      PPrintAttribute( doc, indent, node, att );
    if ( NULL != (att = TY_(AttrGetById)(node, TidyAttr_ENCODING)) )
      PPrintAttribute( doc, indent, node, att );
    if ( NULL != (att = TY_(GetAttrByName)(node, "standalone")) )
      PPrintAttribute( doc, indent, node, att );

    /* restore old config value */
    TY_(SetOptionInt)(doc, TidyUpperCaseAttrs, ucAttrs);

    if ( node->end <= 0 || doc->lexer->lexbuf[node->end - 1] != '?' )
        AddChar( pprint, '?' );
    AddChar( pprint, '>' );
    WrapOn( doc, saveWrap );
    TY_(PFlushLineSmart)( doc, indent );
}